

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O2

int parse_DA_values(char *inArg,uint *DA_x0,uint *DA_y0,uint *DA_x1,uint *DA_y1)

{
  int iVar1;
  char *__nptr;
  ulong uVar2;
  int values [4];
  
  __nptr = strtok(inArg,",");
  for (uVar2 = 0; (__nptr != (char *)0x0 && (uVar2 < 4)); uVar2 = uVar2 + 1) {
    iVar1 = atoi(__nptr);
    values[uVar2] = iVar1;
    __nptr = strtok((char *)0x0,",");
  }
  if (uVar2 == 4) {
    *DA_x0 = values[0];
    *DA_y0 = values[1];
    *DA_x1 = values[2];
    *DA_y1 = values[3];
  }
  return (uint)(uVar2 != 4);
}

Assistant:

int parse_DA_values(char* inArg, unsigned int *DA_x0, unsigned int *DA_y0,
                    unsigned int *DA_x1, unsigned int *DA_y1)
{
    int it = 0;
    int values[4];
    char delims[] = ",";
    char *result = NULL;
    result = strtok(inArg, delims);

    while ((result != NULL) && (it < 4)) {
        values[it] = atoi(result);
        result = strtok(NULL, delims);
        it++;
    }

    if (it != 4) {
        return EXIT_FAILURE;
    } else {
        *DA_x0 = (OPJ_UINT32)values[0];
        *DA_y0 = (OPJ_UINT32)values[1];
        *DA_x1 = (OPJ_UINT32)values[2];
        *DA_y1 = (OPJ_UINT32)values[3];
        return EXIT_SUCCESS;
    }
}